

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

sexp sexp_add(sexp ctx,sexp a,sexp b)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  sexp b_00;
  sexp psVar4;
  long lVar5;
  int iVar6;
  double dVar7;
  double local_48;
  sexp tmp;
  sexp_gc_var_t local_38;
  
  iVar1 = sexp_number_type(a);
  iVar2 = sexp_number_type(b);
  local_38.var = &tmp;
  tmp = (sexp)&DAT_0000043e;
  local_38.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_38;
  psVar4 = a;
  b_00 = b;
  iVar6 = iVar1;
  if (iVar1 <= iVar2) {
    psVar4 = (sexp)&DAT_0000043e;
    b_00 = a;
    a = b;
    iVar6 = iVar2;
    iVar2 = iVar1;
  }
  uVar3 = iVar2 * 6 + iVar6;
  if (0x23 < uVar3) goto switchD_00119df2_caseD_6;
  switch(uVar3) {
  case 0:
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
    psVar4 = sexp_type_exception(ctx,(sexp)0x0,3,b_00);
    break;
  case 7:
    lVar5 = ((long)a >> 1) + ((long)b_00 >> 1);
    if (lVar5 + -0x4000000000000000 < 0) {
      psVar4 = (sexp)(lVar5 * 2 + 1);
    }
    else {
      tmp = sexp_fixnum_to_bignum(ctx,b_00);
      psVar4 = sexp_add(ctx,tmp,a);
    }
    break;
  case 8:
    psVar4 = a;
    if (b_00 == (sexp)&DAT_00000001) break;
    dVar7 = (double)((long)b_00 >> 1);
    goto LAB_00119ede;
  case 9:
    psVar4 = sexp_bignum_add_fixnum(ctx,a,b_00);
    goto LAB_00119ef6;
  case 10:
  case 0x16:
    b_00 = sexp_make_ratio(ctx,b_00,(sexp)&DAT_00000003);
    tmp = b_00;
  case 0x1c:
    psVar4 = sexp_ratio_add(ctx,b_00,a);
    break;
  case 0xb:
  case 0x11:
  case 0x17:
  case 0x1d:
    b_00 = sexp_make_complex(ctx,b_00,(sexp)&DAT_00000001);
    tmp = b_00;
  case 0x23:
    psVar4 = sexp_complex_add(ctx,b_00,a);
    break;
  case 0xe:
    dVar7 = (b_00->value).flonum;
LAB_00119ede:
    dVar7 = dVar7 + (a->value).flonum;
LAB_00119f18:
    psVar4 = sexp_make_flonum(ctx,dVar7);
    break;
  case 0xf:
    local_48 = (b_00->value).flonum;
    dVar7 = sexp_bignum_to_double(a);
    goto LAB_00119f13;
  case 0x10:
    local_48 = (b_00->value).flonum;
    dVar7 = sexp_ratio_to_double(ctx,a);
LAB_00119f13:
    dVar7 = dVar7 + local_48;
    goto LAB_00119f18;
  case 0x15:
    psVar4 = sexp_bignum_add(ctx,(sexp)0x0,a,b_00);
LAB_00119ef6:
    psVar4 = sexp_bignum_normalize(psVar4);
  }
switchD_00119df2_caseD_6:
  (ctx->value).context.saves = local_38.next;
  return psVar4;
}

Assistant:

sexp sexp_add (sexp ctx, sexp a, sexp b) {
  sexp_sint_t sum;
  int at=sexp_number_type(a), bt=sexp_number_type(b), t;
  sexp r=SEXP_VOID;
  sexp_gc_var1(tmp);
  sexp_gc_preserve1(ctx, tmp);
  if (at > bt) {r=a; a=b; b=r; t=at; at=bt; bt=t;}
  switch ((at * SEXP_NUM_NUMBER_TYPES) + bt) {
  case SEXP_NUM_NOT_NOT: case SEXP_NUM_NOT_FIX:
  case SEXP_NUM_NOT_FLO: case SEXP_NUM_NOT_BIG:
#if SEXP_USE_RATIOS
  case SEXP_NUM_NOT_RAT:
#endif
#if SEXP_USE_COMPLEX
  case SEXP_NUM_NOT_CPX:
#endif
    r = sexp_type_exception(ctx, NULL, SEXP_NUMBER, a);
    break;
  case SEXP_NUM_FIX_FIX:
    sum = sexp_unbox_fixnum(a) + sexp_unbox_fixnum(b);
    if ((sum < SEXP_MIN_FIXNUM) || (sum > SEXP_MAX_FIXNUM))
      r = sexp_add(ctx, tmp=sexp_fixnum_to_bignum(ctx, a), b);
    else
      r = sexp_make_fixnum(sum);
    break;
  case SEXP_NUM_FIX_FLO:
    r = a == SEXP_ZERO ? b : sexp_make_flonum(ctx, sexp_fixnum_to_double(a)+sexp_flonum_value(b));
    break;
  case SEXP_NUM_FIX_BIG:
    r = sexp_bignum_normalize(sexp_bignum_add_fixnum(ctx, b, a));
    break;
  case SEXP_NUM_FLO_FLO:
    r = sexp_fp_add(ctx, a, b);
    break;
  case SEXP_NUM_FLO_BIG:
    r = sexp_make_flonum(ctx, sexp_flonum_value(a) + sexp_bignum_to_double(b));
    break;
  case SEXP_NUM_BIG_BIG:
    r = sexp_bignum_normalize(sexp_bignum_add(ctx, NULL, b, a));
    break;
#if SEXP_USE_RATIOS
  case SEXP_NUM_FLO_RAT:
    r = sexp_make_flonum(ctx, sexp_flonum_value(a) + sexp_ratio_to_double(ctx, b));
    break;
  case SEXP_NUM_FIX_RAT:
  case SEXP_NUM_BIG_RAT:
    a = tmp = sexp_make_ratio(ctx, a, SEXP_ONE);
    /* ... FALLTHROUGH ... */
  case SEXP_NUM_RAT_RAT:
    r = sexp_ratio_add(ctx, a, b);
    break;
#endif
#if SEXP_USE_COMPLEX
#if SEXP_USE_RATIOS
  case SEXP_NUM_RAT_CPX:
#endif
  case SEXP_NUM_FLO_CPX:
  case SEXP_NUM_FIX_CPX:
  case SEXP_NUM_BIG_CPX:
    a = tmp = sexp_make_complex(ctx, a, SEXP_ZERO);
    /* ... FALLTHROUGH ... */
  case SEXP_NUM_CPX_CPX:
    r = sexp_complex_add(ctx, a, b);
    break;
#endif
  }
  sexp_gc_release1(ctx);
  return r;
}